

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy.h
# Opt level: O2

int64_t __thiscall
disruptor::MultiThreadedStrategyEx::GetHighestPublishedSequence
          (MultiThreadedStrategyEx *this,int64_t lowerBound,int64_t availableSequence)

{
  while( true ) {
    if (availableSequence < lowerBound) {
      return availableSequence;
    }
    if ((this->available_buffer_).
        super__Vector_base<std::atomic<int>,_std::allocator<std::atomic<int>_>_>._M_impl.
        super__Vector_impl_data._M_start[this->index_mask_ & lowerBound].super___atomic_base<int>.
        _M_i != (int)(lowerBound >> ((byte)this->index_shift_ & 0x3f))) break;
    lowerBound = lowerBound + 1;
  }
  return lowerBound - 1;
}

Assistant:

int64_t GetHighestPublishedSequence(int64_t lowerBound,
                                      int64_t availableSequence) {
    for (int64_t sequence = lowerBound; sequence <= availableSequence;
         sequence++) {
      if (!isAvailable(sequence)) {
        return sequence - 1;
      }
    }

    return availableSequence;
  }